

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeMemCloseIpcHandle(ze_context_handle_t hContext,void *ptr)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeMemCloseIpcHandle(hContext, ptr)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0x3f8) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0x3f8);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeMemCloseIpcHandlePrologue
                               (*(ZEHandleLifetimeValidation **)(lVar2 + 0xd48),hContext,ptr),
           result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hContext,ptr);
          lVar4 = 0;
          goto LAB_001508cb;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
      result = (**(code **)(*plVar1 + 0x650))(plVar1,hContext,ptr);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001508f8;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(lVar2 + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x658))(plVar1,hContext,ptr,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_001508cb:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_001508f8:
  logAndPropagateResult("zeMemCloseIpcHandle",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemCloseIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr                                 ///< [in][release] pointer to device allocation in this process
        )
    {
        context.logger->log_trace("zeMemCloseIpcHandle(hContext, ptr)");

        auto pfnCloseIpcHandle = context.zeDdiTable.Mem.pfnCloseIpcHandle;

        if( nullptr == pfnCloseIpcHandle )
            return logAndPropagateResult("zeMemCloseIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemCloseIpcHandlePrologue( hContext, ptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemCloseIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemCloseIpcHandlePrologue( hContext, ptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemCloseIpcHandle", result);
        }

        auto driver_result = pfnCloseIpcHandle( hContext, ptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemCloseIpcHandleEpilogue( hContext, ptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemCloseIpcHandle", result);
        }

        return logAndPropagateResult("zeMemCloseIpcHandle", driver_result);
    }